

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *
vkt::image::createImageQualifierRestrictCase
          (MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *__return_storage_ptr__,
          TestContext *testCtx,ImageType imageType,string *name)

{
  Texture *pTVar1;
  LoadStoreTest *this;
  long lVar2;
  Texture *pTVar3;
  undefined1 *texture;
  allocator<char> local_49;
  string local_48;
  
  lVar2 = 9;
  pTVar3 = (Texture *)(createImageAtomicOperationTests::formats + 1);
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      texture = (anonymous_namespace)::s_textures;
      break;
    }
    texture = (undefined1 *)(pTVar3 + 1);
    pTVar1 = pTVar3 + 1;
    pTVar3 = (Texture *)texture;
  } while (pTVar1->m_type != imageType);
  this = (LoadStoreTest *)operator_new(0x98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  anon_unknown_0::LoadStoreTest::LoadStoreTest
            (this,testCtx,name,&local_48,(Texture *)texture,VK_FORMAT_R32G32B32A32_UINT,
             VK_FORMAT_R32G32B32A32_UINT,2);
  (__return_storage_ptr__->super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>).
  m_data.ptr = (TestCase *)this;
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<TestCase> createImageQualifierRestrictCase (tcu::TestContext& testCtx, const ImageType imageType, const std::string& name)
{
	const VkFormat format = VK_FORMAT_R32G32B32A32_UINT;
	const Texture& texture = getTestTexture(imageType);
	return de::MovePtr<TestCase>(new LoadStoreTest(testCtx, name, "", texture, format, format, LoadStoreTest::FLAG_RESTRICT_IMAGES));
}